

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_function_list.cpp
# Opt level: O0

uint __thiscall
ON_FunctionList::RemoveFunction
          (ON_FunctionList *this,_func_void_ON__UINT_PTR *function,ON__UINT_PTR function_parameter)

{
  bool bVar1;
  tagFunctionItem *p;
  tagFunctionItem *item;
  int rc;
  ON__UINT_PTR function_parameter_local;
  _func_void_ON__UINT_PTR *function_local;
  ON_FunctionList *this_local;
  
  if (function == (_func_void_ON__UINT_PTR *)0x0) {
    this_local._4_4_ = 2;
  }
  else {
    bVar1 = ON_Lock::GetDefaultLock(&this->m_lock);
    if (bVar1) {
      item._4_4_ = 2;
      p = FindItem((tagFunctionItem *)this->m_head,function);
      if ((p != (tagFunctionItem *)0x0) && (p->m_function_parameter == function_parameter)) {
        item._4_4_ = 1;
        if (p->m_prev == (tagFunctionItem *)0x0) {
          this->m_head = p->m_next;
        }
        else {
          p->m_prev = p->m_next;
        }
        if (p->m_next == (tagFunctionItem *)0x0) {
          this->m_tail = p->m_prev;
        }
        else {
          p->m_next = p->m_prev;
        }
        ON_FixedSizePool::ReturnElement(&this->m_fsp,p);
      }
      ON_Lock::ReturnDefaultLock(&this->m_lock);
      this_local._4_4_ = item._4_4_;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_FunctionList::RemoveFunction(
    void (*function)(ON__UINT_PTR),
    ON__UINT_PTR function_parameter
    )
{
  if ( 0 == function)
    return 2;

  if ( false == m_lock.GetDefaultLock() )
    return 0;

  int rc = 2;
  struct tagFunctionItem* item = FindItem((struct tagFunctionItem*)m_head,function);
  if ( item && item->m_function_parameter == function_parameter )
  {
    rc = 1;
    if ( item->m_prev )
      item->m_prev = item->m_next;
    else
      m_head = item->m_next;
    if ( item->m_next )
      item->m_next = item->m_prev;
    else
      m_tail = item->m_prev;
    m_fsp.ReturnElement(item);
  }

  m_lock.ReturnDefaultLock();

  return rc;
}